

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_column.h
# Opt level: O1

bool __thiscall
Gudhi::persistence_matrix::
Vector_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
::
_add<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>
          (Vector_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
           *this,Vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
                 *column)

{
  ID_index IVar1;
  pointer ppEVar2;
  pointer ppEVar3;
  Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  *pEVar4;
  bool bVar5;
  Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  *__v;
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>,Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>>
  *this_00;
  ulong uVar6;
  pointer ppEVar7;
  Column_support newColumn;
  vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  local_78;
  pointer local_60;
  anon_class_8_1_d68037b6 local_58;
  anon_class_8_1_8991fb9c local_50;
  anon_class_8_1_d68037b6 local_48;
  anon_class_16_2_90bf7f7f local_40;
  
  ppEVar7 = (column->column_).
            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppEVar2 = (column->column_).
            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppEVar7 == ppEVar2) {
    bVar5 = false;
  }
  else if (*(long *)(this + 0x20) == *(long *)(this + 0x28)) {
    std::
    vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
    ::resize((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
              *)(this + 0x20),(long)ppEVar2 - (long)ppEVar7 >> 3);
    ppEVar7 = (column->column_).
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_60 = (column->column_).
               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    bVar5 = true;
    if (ppEVar7 != local_60) {
      uVar6 = 0;
      do {
        pEVar4 = *ppEVar7;
        IVar1 = pEVar4->rowIndex_;
        __v = (Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               *)operator_new(0xc);
        (__v->super_Entry_column_index_option).columnIndex_ = *(uint *)this;
        (__v->super_Entry_field_element_option).element_ = 0;
        __v->rowIndex_ = IVar1;
        (__v->super_Entry_field_element_option).element_ =
             (pEVar4->super_Entry_field_element_option).element_;
        *(Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
          **)(*(long *)(this + 0x20) + uVar6 * 8) = __v;
        local_78.
        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_78.
                               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,IVar1);
        if (*(map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>_>_>_>
              **)(this + 8) !=
            (map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>_>_>_>
             *)0x0) {
          this_00 = (_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>,Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>>
                     *)std::
                       map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>_>_>_>
                       ::operator[](*(map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>_>_>_>
                                      **)(this + 8),(key_type *)&local_78);
          std::
          _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>,Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>>
          ::
          _M_insert_unique<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>const&>
                    (this_00,__v);
        }
        ppEVar7 = ppEVar7 + 1;
        uVar6 = (ulong)((int)uVar6 + 1);
      } while (ppEVar7 != local_60);
      bVar5 = true;
    }
  }
  else {
    local_78.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
    ::reserve(&local_78,
              ((long)ppEVar2 - (long)ppEVar7 >> 3) +
              (*(long *)(this + 0x28) - *(long *)(this + 0x20) >> 3));
    local_58.newColumn = &local_78;
    local_50.this =
         (Vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
          *)this;
    local_48.newColumn = &local_78;
    local_40.newColumn = &local_78;
    local_40.this =
         (Vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
          *)this;
    bVar5 = _generic_add<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>,Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>::_add<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>(Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>const&)::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>*)_1_,Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>::_add<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Chain_col_options<false,(___i_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>*)_2_>
                      (this,column,&local_48,&local_40,&local_50,&local_58);
    ppEVar7 = *(pointer *)(this + 0x20);
    ppEVar2 = *(pointer *)(this + 0x28);
    ppEVar3 = *(pointer *)(this + 0x30);
    *(pointer *)(this + 0x20) =
         local_78.
         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)(this + 0x28) =
         local_78.
         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)(this + 0x30) =
         local_78.
         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (ppEVar7 != (pointer)0x0) {
      local_78.
      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start = ppEVar7;
      local_78.
      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppEVar2;
      local_78.
      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = ppEVar3;
      operator_delete(ppEVar7,(long)ppEVar3 - (long)ppEVar7);
    }
  }
  return bVar5;
}

Assistant:

inline bool Vector_column<Master_matrix>::_add(const Entry_range& column)
{
  if (column.begin() == column.end()) return false;
  if (column_.empty()) {  // chain should never enter here.
    column_.resize(column.size());
    Index i = 0;
    for (const Entry& entry : column) {
      if constexpr (Master_matrix::Option_list::is_z2) {
        _update_entry(entry.get_row_index(), i++);
      } else {
        _update_entry(entry.get_element(), entry.get_row_index(), i++);
      }
    }
    return true;
  }

  Column_support newColumn;
  newColumn.reserve(column_.size() + column.size());  // safe upper bound

  auto pivotIsZeroed = _generic_add(
      column,
      [&](Entry* entryTarget) { newColumn.push_back(entryTarget); },
      [&](typename Entry_range::const_iterator& itSource,
          [[maybe_unused]] const typename Column_support::iterator& itTarget) {
        if constexpr (Master_matrix::Option_list::is_z2) {
          _insert_entry(itSource->get_row_index(), newColumn);
        } else {
          _insert_entry(itSource->get_element(), itSource->get_row_index(), newColumn);
        }
      },
      [&](Field_element& targetElement, typename Entry_range::const_iterator& itSource) {
        if constexpr (!Master_matrix::Option_list::is_z2)
          operators_->add_inplace(targetElement, itSource->get_element());
      },
      [&](Entry* entryTarget) { newColumn.push_back(entryTarget); }
    );

  column_.swap(newColumn);

  return pivotIsZeroed;
}